

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter_avx2.c
# Opt level: O0

void aom_lpf_vertical_14_quad_avx2
               (uchar *s,int pitch,uint8_t *_blimit0,uint8_t *_limit0,uint8_t *_thresh0)

{
  uchar t_dst [256];
  int in_stack_00000450;
  int in_stack_00000454;
  uchar *in_stack_00000458;
  int in_stack_00000464;
  uchar *in_stack_00000468;
  uchar *in_stack_00000848;
  uchar *in_stack_00000850;
  uchar *in_stack_00000858;
  int in_stack_00000864;
  uchar *in_stack_00000868;
  
  trans_store_16x16_lpf_vert14
            (in_stack_00000468,in_stack_00000464,in_stack_00000458,in_stack_00000454,
             in_stack_00000450);
  aom_lpf_horizontal_14_quad_avx2
            (in_stack_00000868,in_stack_00000864,in_stack_00000858,in_stack_00000850,
             in_stack_00000848);
  trans_store_16x16_lpf_vert14
            (in_stack_00000468,in_stack_00000464,in_stack_00000458,in_stack_00000454,
             in_stack_00000450);
  return;
}

Assistant:

void aom_lpf_vertical_14_quad_avx2(unsigned char *s, int pitch,
                                   const uint8_t *_blimit0,
                                   const uint8_t *_limit0,
                                   const uint8_t *_thresh0) {
  DECLARE_ALIGNED(16, unsigned char, t_dst[256]);

  // Transpose 16x16
  trans_store_16x16_lpf_vert14(s - 8, pitch, t_dst, 16, 1);

  // Loop filtering
  aom_lpf_horizontal_14_quad_avx2(t_dst + 8 * 16, 16, _blimit0, _limit0,
                                  _thresh0);

  // Transpose back
  trans_store_16x16_lpf_vert14(t_dst, 16, s - 8, pitch, 0);
}